

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O0

bool TimingResistantEqual<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b)

{
  byte bVar1;
  long lVar2;
  size_type sVar3;
  byte *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  size_t i;
  size_t accumulator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  ulong local_30;
  ulong local_28;
  bool local_9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_stack_ffffffffffffff98);
  if (sVar3 == 0) {
    local_28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                         (in_stack_ffffffffffffff98);
  }
  else {
    local_28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                         (in_stack_ffffffffffffff98);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (in_stack_ffffffffffffff98);
    local_28 = local_28 ^ sVar3;
    for (local_30 = 0;
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(in_stack_ffffffffffffff98), local_30 < sVar3; local_30 = local_30 + 1) {
      pbVar4 = (byte *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (in_stack_ffffffffffffffa8,
                                  CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      bVar1 = *pbVar4;
      in_stack_ffffffffffffffa8 = in_RSI;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (in_stack_ffffffffffffff98);
      pbVar4 = (byte *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (in_stack_ffffffffffffffa8,
                                  CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      local_28 = (long)(int)(char)(bVar1 ^ *pbVar4) | local_28;
    }
  }
  local_9 = local_28 == 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_9;
}

Assistant:

bool TimingResistantEqual(const T& a, const T& b)
{
    if (b.size() == 0) return a.size() == 0;
    size_t accumulator = a.size() ^ b.size();
    for (size_t i = 0; i < a.size(); i++)
        accumulator |= size_t(a[i] ^ b[i%b.size()]);
    return accumulator == 0;
}